

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O2

int flatcc_verify_vector_field
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required,
              size_t elem_size,uint16_t align,size_t max_count)

{
  int iVar1;
  flatbuffers_uoffset_t base;
  uint local_2c;
  
  iVar1 = get_offset_field(td,id,required,&local_2c);
  if (local_2c != 0 && iVar1 == 0) {
    iVar1 = verify_vector(td->buf,td->end,local_2c,
                          *(flatbuffers_uoffset_t *)((long)td->buf + (ulong)local_2c),
                          (flatbuffers_uoffset_t)elem_size,align,(flatbuffers_uoffset_t)max_count);
  }
  return iVar1;
}

Assistant:

int flatcc_verify_vector_field(flatcc_table_verifier_descriptor_t *td,
        voffset_t id, int required, size_t elem_size, uint16_t align, size_t max_count)
{
    uoffset_t base;

    check_field(td, id, required, base);
    return verify_vector(td->buf, td->end, base, read_uoffset(td->buf, base),
        (uoffset_t)elem_size, align, (uoffset_t)max_count);
}